

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O1

void __thiscall pm::NRooks::shuffleXCoords(NRooks *this)

{
  float fVar1;
  pointer pVVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if ((this->super_Sampler).numSets_ != 0) {
    uVar5 = 0;
    do {
      uVar3 = (this->super_Sampler).numSamples_;
      if (uVar3 != 1) {
        uVar7 = 0;
        do {
          uVar6 = uVar7 + uVar5 * uVar3 + 1;
          uVar3 = Random::integer(&(this->super_Sampler).rnd_,0,uVar3);
          uVar4 = (this->super_Sampler).numSamples_ * uVar5 + uVar3;
          pVVar2 = (this->super_Sampler).samples_.
                   super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar1 = pVVar2[uVar6].x;
          pVVar2[uVar6].x = pVVar2[uVar4].x;
          pVVar2[uVar4].x = fVar1;
          uVar7 = uVar7 + 1;
          uVar3 = (this->super_Sampler).numSamples_;
        } while (uVar7 < uVar3 - 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Sampler).numSets_);
  }
  return;
}

Assistant:

void NRooks::shuffleXCoords()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_ - 1; i++)
		{
			const int unsigned source = i + p * numSamples_ + 1;
			const int unsigned target = rnd_.integer(0, numSamples_) + p * numSamples_;

			const float temp = samples_[source].x;
			samples_[source].x = samples_[target].x;
			samples_[target].x = temp;
		}
}